

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum10.h
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
CScriptNum10::serialize
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          int64_t *value)

{
  byte bVar1;
  ulong uVar2;
  pointer puVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  byte local_2a;
  uchar local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *value;
  if (uVar2 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_004ecde6;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar4 = -uVar2;
    if (0 < (long)uVar2) {
      uVar4 = uVar2;
    }
    for (; uVar4 != 0; uVar4 = uVar4 >> 8) {
      local_29 = (uchar)uVar4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_29);
    }
    puVar3 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar1 = puVar3[-1];
    if ((char)bVar1 < '\0') {
      local_2a = (byte)(uVar2 >> 0x38) & 0x80;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_2a);
    }
    else if ((long)uVar2 < 0) {
      puVar3[-1] = bVar1 | 0x80;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_004ecde6:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<unsigned char> serialize(const int64_t& value)
    {
        if(value == 0)
            return std::vector<unsigned char>();

        std::vector<unsigned char> result;
        const bool neg = value < 0;
        uint64_t absvalue = neg ? -value : value;

        while(absvalue)
        {
            result.push_back(absvalue & 0xff);
            absvalue >>= 8;
        }

//    - If the most significant byte is >= 0x80 and the value is positive, push a
//    new zero-byte to make the significant byte < 0x80 again.

//    - If the most significant byte is >= 0x80 and the value is negative, push a
//    new 0x80 byte that will be popped off when converting to an integral.

//    - If the most significant byte is < 0x80 and the value is negative, add
//    0x80 to it, since it will be subtracted and interpreted as a negative when
//    converting to an integral.

        if (result.back() & 0x80)
            result.push_back(neg ? 0x80 : 0);
        else if (neg)
            result.back() |= 0x80;

        return result;
    }